

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O2

void __thiscall Diligent::StringPool::AssignMemory(StringPool *this,Char *pBuffer,size_t Size)

{
  string msg;
  
  if (this->m_ReservedSize != 0) {
    FormatString<char[28]>(&msg,(char (*) [28])"Pool is already initialized");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AssignMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x6e);
    std::__cxx11::string::~string((string *)&msg);
  }
  this->m_ReservedSize = Size;
  this->m_pBuffer = pBuffer;
  this->m_pCurrPtr = pBuffer;
  return;
}

Assistant:

void AssignMemory(Char* pBuffer, size_t Size)
    {
        VERIFY(m_ReservedSize == 0, "Pool is already initialized");
        m_ReservedSize = Size;
        m_pBuffer      = pBuffer;
        m_pCurrPtr     = m_pBuffer;
    }